

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O1

Response execute_command(IteratorPopCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  DatabaseSnapshot *in_RCX;
  json_value extraout_RDX;
  Response RVar1;
  uint64_t total_files;
  uint64_t iterator_position;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  uint64_t local_38;
  uint64_t local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DatabaseSnapshot::read_iterator
            (in_RCX,(Task *)snap,(string *)task,*(int *)&task[1].spec_,&local_28,&local_30,&local_38
            );
  Response::select_from_iterator((Response *)cmd,&local_28,local_30,local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  RVar1.content.m_value.object = extraout_RDX.object;
  RVar1.content._0_8_ = cmd;
  return (Response)RVar1.content;
}

Assistant:

Response execute_command(const IteratorPopCommand &cmd, Task *task,
                         const DatabaseSnapshot *snap) {
    std::vector<std::string> out;
    uint64_t iterator_position;
    uint64_t total_files;
    snap->read_iterator(task, cmd.get_iterator_id(), cmd.elements_to_pop(),
                        &out, &iterator_position, &total_files);

    return Response::select_from_iterator(out, iterator_position, total_files);
}